

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

int dic_add(dictionary *dic,void *key,int keyn)

{
  uint32_t uVar1;
  int iVar2;
  keynode *pkVar3;
  uint uVar4;
  double dVar5;
  keynode *k2;
  keynode *k;
  double f;
  int n;
  int keyn_local;
  void *key_local;
  dictionary *dic_local;
  
  uVar1 = meiyan((char *)key,keyn);
  uVar4 = uVar1 % (uint)dic->length;
  if (dic->table[(int)uVar4] == (keynode *)0x0) {
    dVar5 = (double)dic->count / (double)dic->length;
    if (dVar5 < dic->growth_treshold || dVar5 == dic->growth_treshold) {
      pkVar3 = keynode_new((char *)key,keyn);
      dic->table[(int)uVar4] = pkVar3;
      dic->value = &dic->table[(int)uVar4]->value;
      dic->count = dic->count + 1;
      dic_local._4_4_ = 0;
    }
    else {
      dic_resize(dic,(int)((double)dic->length * dic->growth_factor));
      dic_local._4_4_ = dic_add(dic,key,keyn);
    }
  }
  else {
    for (k2 = dic->table[(int)uVar4]; k2 != (keynode *)0x0; k2 = k2->next) {
      if (((uint)k2->len == keyn) && (iVar2 = memcmp(k2->key,key,(long)keyn), iVar2 == 0)) {
        dic->value = &k2->value;
        return 1;
      }
    }
    dic->count = dic->count + 1;
    pkVar3 = keynode_new((char *)key,keyn);
    pkVar3->next = dic->table[(int)uVar4];
    dic->table[(int)uVar4] = pkVar3;
    dic->value = &pkVar3->value;
    dic_local._4_4_ = 0;
  }
  return dic_local._4_4_;
}

Assistant:

int dic_add(struct dictionary* dic, void *key, int keyn) {
	int n = hash_func((const char*)key, keyn) % dic->length;
	if (dic->table[n] == 0) {
		double f = (double)dic->count / (double)dic->length;
		if (f > dic->growth_treshold) {
			dic_resize(dic, dic->length * dic->growth_factor);
			return dic_add(dic, key, keyn);
		}
		dic->table[n] = keynode_new((char*)key, keyn);
		dic->value = &dic->table[n]->value;
		dic->count++;
		return 0;
	}
	struct keynode *k = dic->table[n];
	while (k) {
		if (k->len == keyn && memcmp(k->key, key, keyn) == 0) {
			dic->value = &k->value;
			return 1;
		}
		k = k->next;
	}
	dic->count++;
	struct keynode *k2 = keynode_new((char*)key, keyn);
	k2->next = dic->table[n];
	dic->table[n] = k2;
	dic->value = &k2->value;
	return 0;
}